

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

PropertyId Js::JavascriptOperators::GetPropertyId(Var propertyName,ScriptContext *scriptContext)

{
  bool bVar1;
  PropertyId PVar2;
  JavascriptString *propertyString;
  JavascriptSymbolObject *local_58;
  JavascriptSymbol *local_50;
  JavascriptString *indexStr;
  JavascriptSymbolObject *symbolObject;
  JavascriptSymbol *symbol;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext_local;
  Var propertyName_local;
  ScriptContext *local_10;
  
  symbol = (JavascriptSymbol *)0x0;
  propertyRecord = (PropertyRecord *)scriptContext;
  scriptContext_local = (ScriptContext *)propertyName;
  propertyName_local = propertyName;
  bVar1 = VarIs<Js::JavascriptSymbol>(propertyName);
  if (bVar1) {
    local_50 = UnsafeVarTo<Js::JavascriptSymbol>(propertyName_local);
  }
  else {
    local_50 = (JavascriptSymbol *)0x0;
  }
  if (local_50 == (JavascriptSymbol *)0x0) {
    local_10 = scriptContext_local;
    bVar1 = VarIs<Js::JavascriptSymbolObject>(scriptContext_local);
    if (bVar1) {
      local_58 = UnsafeVarTo<Js::JavascriptSymbolObject>(local_10);
    }
    else {
      local_58 = (JavascriptSymbolObject *)0x0;
    }
    if (local_58 == (JavascriptSymbolObject *)0x0) {
      propertyString =
           JavascriptConversion::ToString(scriptContext_local,(ScriptContext *)propertyRecord);
      ScriptContext::GetOrAddPropertyRecord
                ((ScriptContext *)propertyRecord,propertyString,(PropertyRecord **)&symbol);
    }
    else {
      symbol = (JavascriptSymbol *)JavascriptSymbolObject::GetValue(local_58);
    }
  }
  else {
    symbol = (JavascriptSymbol *)JavascriptSymbol::GetValue(local_50);
  }
  PVar2 = PropertyRecord::GetPropertyId((PropertyRecord *)symbol);
  return PVar2;
}

Assistant:

Js::PropertyId JavascriptOperators::GetPropertyId(Var propertyName, ScriptContext* scriptContext)
    {
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<Js::JavascriptSymbol>(propertyName);
        if (symbol)
        {
            propertyRecord = symbol->GetValue();
        }
        else
        {
            JavascriptSymbolObject * symbolObject = JavascriptOperators::TryFromVar<JavascriptSymbolObject>(propertyName);
            if (symbolObject)
            {
                propertyRecord = symbolObject->GetValue();
            }
            else
            {
                JavascriptString * indexStr = JavascriptConversion::ToString(propertyName, scriptContext);
                scriptContext->GetOrAddPropertyRecord(indexStr, &propertyRecord);
            }
        }

        return propertyRecord->GetPropertyId();
    }